

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

bool __thiscall
testing::internal::
TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
::Matches(TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
          *this,ArgumentTuple *args)

{
  bool bVar1;
  bool local_19;
  ArgumentTuple *args_local;
  TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  *this_local;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  bVar1 = TupleMatches<std::tuple<testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>&>,testing::Matcher<ot::commissioner::Config_const&>>,std::tuple<std::shared_ptr<ot::commissioner::CommissionerApp>&,ot::commissioner::Config_const&>>
                    (&this->matchers_,args);
  local_19 = false;
  if (bVar1) {
    local_19 = MatcherBase<const_std::tuple<std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&>_&>
               ::Matches(&(this->extra_matcher_).
                          super_MatcherBase<const_std::tuple<std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&>_&>
                         ,args);
  }
  return local_19;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }